

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

void secp256k1_scratch_space_destroy(secp256k1_context *ctx,secp256k1_scratch_space *scratch)

{
  if (scratch == (secp256k1_scratch_space *)0x0) {
    return;
  }
  if (*(long *)scratch->magic != 0x68637461726373) {
    (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
    return;
  }
  free(scratch);
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        if (memcmp(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}